

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borromean_impl.h
# Opt level: O0

int secp256k1_borromean_sign
              (secp256k1_ecmult_gen_context *ecmult_gen_ctx,uchar *e0,secp256k1_scalar *s,
              secp256k1_gej *pubs,secp256k1_scalar *k,secp256k1_scalar *sec,size_t *rsizes,
              size_t *secidx,size_t nrings,uchar *m,size_t mlen)

{
  int iVar1;
  int local_1ec;
  size_t sStack_1e8;
  int overflow;
  size_t size;
  size_t count;
  size_t j;
  size_t i;
  uchar tmp [33];
  secp256k1_sha256 sha256_e0;
  secp256k1_scalar ens;
  secp256k1_ge rge;
  secp256k1_gej rgej;
  secp256k1_scalar *sec_local;
  secp256k1_scalar *k_local;
  secp256k1_gej *pubs_local;
  secp256k1_scalar *s_local;
  uchar *e0_local;
  secp256k1_ecmult_gen_context *ecmult_gen_ctx_local;
  
  secp256k1_sha256_initialize((secp256k1_sha256 *)(tmp + 0x20));
  size = 0;
  for (j = 0; j < nrings; j = j + 1) {
    secp256k1_ecmult_gen(ecmult_gen_ctx,(secp256k1_gej *)&rge.infinity,k + j);
    secp256k1_ge_set_gej((secp256k1_ge *)(ens.d + 3),(secp256k1_gej *)&rge.infinity);
    iVar1 = secp256k1_gej_is_infinity((secp256k1_gej *)&rge.infinity);
    if (iVar1 != 0) {
      return 0;
    }
    secp256k1_eckey_pubkey_serialize
              ((secp256k1_ge *)(ens.d + 3),(uchar *)&i,&stack0xfffffffffffffe18,1);
    count = secidx[j];
    while (count = count + 1, count < rsizes[j]) {
      secp256k1_borromean_hash((uchar *)&i,m,mlen,(uchar *)&i,0x21,j,count);
      secp256k1_scalar_set_b32((secp256k1_scalar *)&sha256_e0.bytes,(uchar *)&i,&local_1ec);
      if ((local_1ec != 0) ||
         (iVar1 = secp256k1_scalar_is_zero((secp256k1_scalar *)&sha256_e0.bytes), iVar1 != 0)) {
        return 0;
      }
      secp256k1_ecmult((secp256k1_gej *)&rge.infinity,pubs + size + count,
                       (secp256k1_scalar *)&sha256_e0.bytes,s + size + count);
      iVar1 = secp256k1_gej_is_infinity((secp256k1_gej *)&rge.infinity);
      if (iVar1 != 0) {
        return 0;
      }
      secp256k1_ge_set_gej_var((secp256k1_ge *)(ens.d + 3),(secp256k1_gej *)&rge.infinity);
      secp256k1_eckey_pubkey_serialize
                ((secp256k1_ge *)(ens.d + 3),(uchar *)&i,&stack0xfffffffffffffe18,1);
    }
    secp256k1_sha256_write((secp256k1_sha256 *)(tmp + 0x20),(uchar *)&i,sStack_1e8);
    size = rsizes[j] + size;
  }
  secp256k1_sha256_write((secp256k1_sha256 *)(tmp + 0x20),m,mlen);
  secp256k1_sha256_finalize((secp256k1_sha256 *)(tmp + 0x20),e0);
  size = 0;
  j = 0;
  do {
    if (nrings <= j) {
      secp256k1_scalar_clear((secp256k1_scalar *)&sha256_e0.bytes);
      secp256k1_ge_clear((secp256k1_ge *)(ens.d + 3));
      secp256k1_gej_clear((secp256k1_gej *)&rge.infinity);
      memset(&i,0,0x21);
      return 1;
    }
    secp256k1_borromean_hash((uchar *)&i,m,mlen,e0,0x20,j,0);
    secp256k1_scalar_set_b32((secp256k1_scalar *)&sha256_e0.bytes,(uchar *)&i,&local_1ec);
    if ((local_1ec != 0) ||
       (iVar1 = secp256k1_scalar_is_zero((secp256k1_scalar *)&sha256_e0.bytes), iVar1 != 0)) {
      return 0;
    }
    for (count = 0; count < secidx[j]; count = count + 1) {
      secp256k1_ecmult((secp256k1_gej *)&rge.infinity,pubs + size + count,
                       (secp256k1_scalar *)&sha256_e0.bytes,s + size + count);
      iVar1 = secp256k1_gej_is_infinity((secp256k1_gej *)&rge.infinity);
      if (iVar1 != 0) {
        return 0;
      }
      secp256k1_ge_set_gej_var((secp256k1_ge *)(ens.d + 3),(secp256k1_gej *)&rge.infinity);
      secp256k1_eckey_pubkey_serialize
                ((secp256k1_ge *)(ens.d + 3),(uchar *)&i,&stack0xfffffffffffffe18,1);
      secp256k1_borromean_hash((uchar *)&i,m,mlen,(uchar *)&i,0x21,j,count + 1);
      secp256k1_scalar_set_b32((secp256k1_scalar *)&sha256_e0.bytes,(uchar *)&i,&local_1ec);
      if ((local_1ec != 0) ||
         (iVar1 = secp256k1_scalar_is_zero((secp256k1_scalar *)&sha256_e0.bytes), iVar1 != 0)) {
        return 0;
      }
    }
    secp256k1_scalar_mul(s + size + count,(secp256k1_scalar *)&sha256_e0.bytes,sec + j);
    secp256k1_scalar_negate(s + size + count,s + size + count);
    secp256k1_scalar_add(s + size + count,s + size + count,k + j);
    iVar1 = secp256k1_scalar_is_zero(s + size + count);
    if (iVar1 != 0) {
      return 0;
    }
    size = rsizes[j] + size;
    j = j + 1;
  } while( true );
}

Assistant:

int secp256k1_borromean_sign(const secp256k1_ecmult_gen_context *ecmult_gen_ctx,
 unsigned char *e0, secp256k1_scalar *s, const secp256k1_gej *pubs, const secp256k1_scalar *k, const secp256k1_scalar *sec,
 const size_t *rsizes, const size_t *secidx, size_t nrings, const unsigned char *m, size_t mlen) {
    secp256k1_gej rgej;
    secp256k1_ge rge;
    secp256k1_scalar ens;
    secp256k1_sha256 sha256_e0;
    unsigned char tmp[33];
    size_t i;
    size_t j;
    size_t count;
    size_t size;
    int overflow;
    VERIFY_CHECK(ecmult_gen_ctx != NULL);
    VERIFY_CHECK(e0 != NULL);
    VERIFY_CHECK(s != NULL);
    VERIFY_CHECK(pubs != NULL);
    VERIFY_CHECK(k != NULL);
    VERIFY_CHECK(sec != NULL);
    VERIFY_CHECK(rsizes != NULL);
    VERIFY_CHECK(secidx != NULL);
    VERIFY_CHECK(nrings > 0);
    VERIFY_CHECK(m != NULL);
    secp256k1_sha256_initialize(&sha256_e0);
    count = 0;
    for (i = 0; i < nrings; i++) {
        VERIFY_CHECK(INT_MAX - count > rsizes[i]);
        secp256k1_ecmult_gen(ecmult_gen_ctx, &rgej, &k[i]);
        secp256k1_ge_set_gej(&rge, &rgej);
        if (secp256k1_gej_is_infinity(&rgej)) {
            return 0;
        }
        secp256k1_eckey_pubkey_serialize(&rge, tmp, &size, 1);
        for (j = secidx[i] + 1; j < rsizes[i]; j++) {
            secp256k1_borromean_hash(tmp, m, mlen, tmp, 33, i, j);
            secp256k1_scalar_set_b32(&ens, tmp, &overflow);
            if (overflow || secp256k1_scalar_is_zero(&ens)) {
                return 0;
            }
            /** The signing algorithm as a whole is not memory uniform so there is likely a cache sidechannel that
             *  leaks which members are non-forgeries. That the forgeries themselves are variable time may leave
             *  an additional privacy impacting timing side-channel, but not a key loss one.
             */
            secp256k1_ecmult(&rgej, &pubs[count + j], &ens, &s[count + j]);
            if (secp256k1_gej_is_infinity(&rgej)) {
                return 0;
            }
            secp256k1_ge_set_gej_var(&rge, &rgej);
            secp256k1_eckey_pubkey_serialize(&rge, tmp, &size, 1);
        }
        secp256k1_sha256_write(&sha256_e0, tmp, size);
        count += rsizes[i];
    }
    secp256k1_sha256_write(&sha256_e0, m, mlen);
    secp256k1_sha256_finalize(&sha256_e0, e0);
    count = 0;
    for (i = 0; i < nrings; i++) {
        VERIFY_CHECK(INT_MAX - count > rsizes[i]);
        secp256k1_borromean_hash(tmp, m, mlen, e0, 32, i, 0);
        secp256k1_scalar_set_b32(&ens, tmp, &overflow);
        if (overflow || secp256k1_scalar_is_zero(&ens)) {
            return 0;
        }
        for (j = 0; j < secidx[i]; j++) {
            secp256k1_ecmult(&rgej, &pubs[count + j], &ens, &s[count + j]);
            if (secp256k1_gej_is_infinity(&rgej)) {
                return 0;
            }
            secp256k1_ge_set_gej_var(&rge, &rgej);
            secp256k1_eckey_pubkey_serialize(&rge, tmp, &size, 1);
            secp256k1_borromean_hash(tmp, m, mlen, tmp, 33, i, j + 1);
            secp256k1_scalar_set_b32(&ens, tmp, &overflow);
            if (overflow || secp256k1_scalar_is_zero(&ens)) {
                return 0;
            }
        }
        secp256k1_scalar_mul(&s[count + j], &ens, &sec[i]);
        secp256k1_scalar_negate(&s[count + j], &s[count + j]);
        secp256k1_scalar_add(&s[count + j], &s[count + j], &k[i]);
        if (secp256k1_scalar_is_zero(&s[count + j])) {
            return 0;
        }
        count += rsizes[i];
    }
    secp256k1_scalar_clear(&ens);
    secp256k1_ge_clear(&rge);
    secp256k1_gej_clear(&rgej);
    memset(tmp, 0, 33);
    return 1;
}